

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::IGXMLScanner::updateNSMap
          (IGXMLScanner *this,XMLCh *attrName,XMLCh *attrValue,int colonOfs)

{
  XMLStringPool *pXVar1;
  bool bVar2;
  uint uriId;
  XMLBuffer *toFill;
  XMLCh *str1;
  XMLCh *local_60;
  XMLCh *prefPtr;
  XMLCh *namespaceURI;
  XMLBuffer *normalBuf;
  XMLBufBid bbNormal;
  int colonOfs_local;
  XMLCh *attrValue_local;
  XMLCh *attrName_local;
  IGXMLScanner *this_local;
  
  bbNormal.fMgr._4_4_ = colonOfs;
  XMLBufBid::XMLBufBid((XMLBufBid *)&normalBuf,&(this->super_XMLScanner).fBufMgr);
  toFill = XMLBufBid::getBuffer((XMLBufBid *)&normalBuf);
  normalizeAttRawValue(this,attrName,attrValue,toFill);
  str1 = XMLBuffer::getRawBuffer(toFill);
  local_60 = L"";
  if (bbNormal.fMgr._4_4_ != -1) {
    local_60 = attrName + (long)bbNormal.fMgr._4_4_ + 1;
    bVar2 = XMLString::equals(local_60,(XMLCh *)XMLUni::fgXMLNSString);
    if (bVar2) {
      XMLScanner::emitError(&this->super_XMLScanner,NoUseOfxmlnsAsPrefix);
    }
    else {
      bVar2 = XMLString::equals(local_60,L"xml");
      if ((bVar2) && (bVar2 = XMLString::equals(str1,(XMLCh *)XMLUni::fgXMLURIName), !bVar2)) {
        XMLScanner::emitError(&this->super_XMLScanner,PrefixXMLNotMatchXMLURI);
      }
    }
    if (str1 == (XMLCh *)0x0) {
      XMLScanner::emitError
                (&this->super_XMLScanner,NoEmptyStrNamespace,attrName,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    else if ((*str1 == L'\0') && ((this->super_XMLScanner).fXMLVersion == XMLV1_0)) {
      XMLScanner::emitError
                (&this->super_XMLScanner,NoEmptyStrNamespace,attrName,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
  }
  bVar2 = XMLString::equals(str1,(XMLCh *)XMLUni::fgXMLNSURIName);
  if (bVar2) {
    XMLScanner::emitError(&this->super_XMLScanner,NoUseOfxmlnsURI);
  }
  else {
    bVar2 = XMLString::equals(str1,(XMLCh *)XMLUni::fgXMLURIName);
    if ((bVar2) && (bVar2 = XMLString::equals(local_60,L"xml"), !bVar2)) {
      XMLScanner::emitError(&this->super_XMLScanner,XMLURINotMatchXMLPrefix);
    }
  }
  pXVar1 = (this->super_XMLScanner).fURIStringPool;
  uriId = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,str1);
  ElemStack::addPrefix(&(this->super_XMLScanner).fElemStack,local_60,uriId);
  XMLBufBid::~XMLBufBid((XMLBufBid *)&normalBuf);
  return;
}

Assistant:

void IGXMLScanner::updateNSMap(const  XMLCh* const    attrName
                            , const XMLCh* const    attrValue
                            , const int colonOfs)
{
    // We need a buffer to normalize the attribute value into
    XMLBufBid bbNormal(&fBufMgr);
    XMLBuffer& normalBuf = bbNormal.getBuffer();

    //  Normalize the value into the passed buffer. In this case, we don't
    //  care about the return value. An error was issued for the error, which
    //  is all we care about here.
    normalizeAttRawValue(attrName, attrValue, normalBuf);
    XMLCh* namespaceURI = normalBuf.getRawBuffer();

    //  We either have the default prefix (""), or we point it into the attr
    //  name parameter. Note that the xmlns is not the prefix we care about
    //  here. To us, the 'prefix' is really the local part of the attrName
    //  parameter.
    //
    //  Check 1. xxx is not xmlns
    //        2. if xxx is xml, then yyy must match XMLUni::fgXMLURIName, and vice versa
    //        3. yyy is not XMLUni::fgXMLNSURIName
    //        4. if xxx is not null, then yyy cannot be an empty string.
    const XMLCh* prefPtr = XMLUni::fgZeroLenString;
    if (colonOfs != -1) {
        prefPtr = &attrName[colonOfs + 1];

        if (XMLString::equals(prefPtr, XMLUni::fgXMLNSString))
            emitError(XMLErrs::NoUseOfxmlnsAsPrefix);
        else if (XMLString::equals(prefPtr, XMLUni::fgXMLString)) {
            if (!XMLString::equals(namespaceURI, XMLUni::fgXMLURIName))
                emitError(XMLErrs::PrefixXMLNotMatchXMLURI);
        }

        if (!namespaceURI)
            emitError(XMLErrs::NoEmptyStrNamespace, attrName);
        else if(!*namespaceURI && fXMLVersion == XMLReader::XMLV1_0)
            emitError(XMLErrs::NoEmptyStrNamespace, attrName);
    }

    if (XMLString::equals(namespaceURI, XMLUni::fgXMLNSURIName))
        emitError(XMLErrs::NoUseOfxmlnsURI);
    else if (XMLString::equals(namespaceURI, XMLUni::fgXMLURIName)) {
        if (!XMLString::equals(prefPtr, XMLUni::fgXMLString))
            emitError(XMLErrs::XMLURINotMatchXMLPrefix);
    }

    //  Ok, we have to get the unique id for the attribute value, which is the
    //  URI that this value should be mapped to. The validator has the
    //  namespace string pool, so we ask him to find or add this new one. Then
    //  we ask the element stack to add this prefix to URI Id mapping.
    fElemStack.addPrefix
    (
        prefPtr
        , fURIStringPool->addOrFind(namespaceURI)
    );
}